

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnfData.c
# Opt level: O1

void Cnf_ReadMsops(char **ppSopSizes,char ***ppSops)

{
  long lVar1;
  char **ppcVar2;
  char *pcVar3;
  ulong uVar4;
  char *pcVar5;
  char *pcVar6;
  long lVar7;
  int iVar8;
  size_t __size;
  char cVar9;
  uint uVar10;
  ulong uVar11;
  bool bVar12;
  char Map [256];
  char acStack_128 [256];
  
  memset(acStack_128,0xff,0x100);
  lVar1 = 0;
  do {
    acStack_128
    ["!#&()*+,-.0123456789:;<=>?ABCDEFGHIJKLMNOPQRSTUVWXYZ[]abcdefghijklmnopqrstuvwxyz|"[lVar1]] =
         (char)lVar1;
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0x51);
  uVar11 = 0xffffffffffffffff;
  __size = 0xffffffffffffffb5;
  ppcVar2 = s_Data4;
  do {
    uVar11 = uVar11 + 1;
    __size = __size + 0x4b;
    if (99999 < uVar11) break;
    pcVar3 = *ppcVar2;
    ppcVar2 = ppcVar2 + 1;
  } while (pcVar3 != (char *)0x0);
  if (99999 < uVar11) {
    __assert_fail("Size < 100000",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/cnf/cnfData.c"
                  ,0x11cd,"void Cnf_ReadMsops(char **, char ***)");
  }
  pcVar3 = (char *)malloc(__size);
  if (uVar11 != 0) {
    uVar4 = 0;
    pcVar6 = pcVar3;
    do {
      pcVar5 = s_Data4[uVar4];
      lVar1 = 0;
      do {
        cVar9 = -1;
        if ((long)pcVar5[lVar1] != 0x20) {
          cVar9 = acStack_128[pcVar5[lVar1]];
        }
        pcVar6[lVar1] = cVar9;
        lVar1 = lVar1 + 1;
      } while (lVar1 != 0x4b);
      uVar4 = uVar4 + 1;
      pcVar6 = pcVar6 + 0x4b;
    } while (uVar11 != uVar4);
  }
  pcVar5 = (char *)malloc(0x10000);
  ppcVar2 = (char **)malloc(0x80000);
  *pcVar5 = '\0';
  *ppcVar2 = (char *)0x0;
  iVar8 = 1;
  uVar11 = (ulong)pcVar3 & 0xffffffff;
  pcVar6 = pcVar3;
  do {
    if (*pcVar6 == -1) {
      pcVar5[iVar8] = (char)uVar11 - (char)pcVar3;
      ppcVar2[iVar8] = pcVar3;
      pcVar3 = pcVar6 + 1;
      iVar8 = iVar8 + 1;
    }
    uVar11 = (ulong)(byte)((char)uVar11 + 1);
    pcVar6 = pcVar6 + 1;
  } while (iVar8 < 0x10000);
  *ppSopSizes = pcVar5;
  *ppSops = ppcVar2;
  uVar11 = 1;
  while( true ) {
    if ((long)pcVar5[uVar11] < 1) {
      uVar4 = 0;
    }
    else {
      lVar1 = 0;
      uVar4 = 0;
      do {
        uVar10 = 0xffff;
        lVar7 = 3;
        iVar8 = (int)ppcVar2[uVar11][lVar1];
        do {
          if (iVar8 % 3 == 1) {
            uVar10 = uVar10 & (&DAT_008dc1f4)[lVar7 * 2];
          }
          else if (iVar8 % 3 == 0) {
            uVar10 = uVar10 & (&DAT_008dc1f0)[lVar7 * 2];
          }
          bVar12 = lVar7 != 0;
          lVar7 = lVar7 + -1;
          iVar8 = iVar8 / 3;
        } while (bVar12);
        uVar4 = (ulong)((uint)uVar4 | uVar10);
        lVar1 = lVar1 + 1;
      } while (lVar1 != pcVar5[uVar11]);
    }
    if (uVar4 != uVar11) break;
    uVar11 = uVar11 + 1;
    if (uVar11 == 0x10000) {
      return;
    }
  }
  __assert_fail("uTruth == i",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/cnf/cnfData.c"
                ,0x11fb,"void Cnf_ReadMsops(char **, char ***)");
}

Assistant:

void Cnf_ReadMsops( char ** ppSopSizes, char *** ppSops )
{
    unsigned uMasks[4][2] = {
        { 0x5555, 0xAAAA },
        { 0x3333, 0xCCCC },
        { 0x0F0F, 0xF0F0 },
        { 0x00FF, 0xFF00 }
    };
    char Map[256], * pPrev, * pMemory;
    char * pSopSizes, ** pSops;
    int i, k, b, Size;

    // map chars into their numbers
    for ( i = 0; i < 256; i++ )
        Map[i] = (char)(-1);
    for ( i = 0; i < 81; i++ )
        Map[(int)s_Data3[i]] = (char)i;

    // count the number of strings
    for ( Size = 0; s_Data4[Size] && Size < 100000; Size++ );
    assert( Size < 100000 );

    // allocate memory
    pMemory = ABC_ALLOC( char, Size * 75 );
    // copy the array into memory
    for ( i = 0; i < Size; i++ )
        for ( k = 0; k < 75; k++ )
            if ( s_Data4[i][k] == ' ' )
                pMemory[i*75+k] = (char)(-1);
            else
                pMemory[i*75+k] = Map[(int)s_Data4[i][k]];

    // set pointers and compute SOP sizes
    pSopSizes = ABC_ALLOC( char, 65536 );
    pSops = ABC_ALLOC( char *, 65536 );
    pSopSizes[0] = 0;
    pSops[0] = NULL;
    pPrev = pMemory;
    for ( k = 0, i = 1; i < 65536; k++ )
        if ( pMemory[k] == (char)(-1) )
        {
            pSopSizes[i] = pMemory + k - pPrev; 
            pSops[i++] = pPrev;
            pPrev = pMemory + k + 1;
        }
    *ppSopSizes = pSopSizes;
    *ppSops = pSops;

    // verify the results - derive truth table from SOP
    for ( i = 1; i < 65536; i++ )
    {
        int uTruth = 0, uCube, Lit;
        for ( k = 0; k < pSopSizes[i]; k++ )
        {
            uCube = 0xFFFF;
            Lit = pSops[i][k];
            for ( b = 3; b >= 0; b-- )
            {
                if ( Lit % 3 == 0 )
                    uCube &= uMasks[b][0];
                else if ( Lit % 3 == 1 )
                    uCube &= uMasks[b][1];
                Lit = Lit / 3;
            }
            uTruth |= uCube;
        }
        assert( uTruth == i );
    }
}